

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O0

undefined8
duckdb_apache::thrift::to_string<duckdb_parquet::KeyValue>
          (vector<duckdb_parquet::KeyValue,_true> *t)

{
  ostream *poVar1;
  undefined8 in_RDI;
  ostringstream o;
  vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
  *in_stack_fffffffffffffe08;
  string local_1b8 [48];
  ostringstream local_188 [328];
  __normal_iterator<const_duckdb_parquet::KeyValue_*,_std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_duckdb_parquet::KeyValue_*,_std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>_>
  *in_stack_ffffffffffffffc8;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"[");
  std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::begin
            (in_stack_fffffffffffffe08);
  std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::end
            (in_stack_fffffffffffffe08);
  to_string<__gnu_cxx::__normal_iterator<duckdb_parquet::KeyValue_const*,std::vector<duckdb_parquet::KeyValue,std::allocator<duckdb_parquet::KeyValue>>>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  poVar1 = std::operator<<(poVar1,local_1b8);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string to_string(const duckdb::vector<T>& t) {
  std::ostringstream o;
  o << "[" << to_string(t.begin(), t.end()) << "]";
  return o.str();
}